

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

void t1_builder_close_contour(T1_Builder builder)

{
  ushort uVar1;
  FT_Outline *pFVar2;
  FT_Vector *pFVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  pFVar2 = builder->current;
  if (pFVar2 == (FT_Outline *)0x0) {
    return;
  }
  uVar1 = pFVar2->n_contours;
  if ((short)uVar1 < 2) {
    uVar6 = 0;
    if (uVar1 == 0) {
      uVar5 = (uint)(ushort)pFVar2->n_points;
      uVar6 = 0;
      goto LAB_0022d3ee;
    }
  }
  else {
    uVar6 = (int)pFVar2->contours[(int)(short)uVar1 - 2] + 1;
  }
  uVar5 = (uint)pFVar2->n_points;
  if (uVar6 == uVar5) {
    pFVar2->n_contours = uVar1 - 1;
    return;
  }
LAB_0022d3ee:
  sVar4 = (short)uVar5;
  if (1 < sVar4) {
    pFVar3 = pFVar2->points;
    uVar7 = (ulong)((uVar5 & 0xffff) << 4);
    if (((pFVar3[(int)uVar6].x == *(long *)((long)&pFVar3[-1].x + uVar7)) &&
        (pFVar3[(int)uVar6].y == *(long *)((long)pFVar3 + (uVar7 - 8)))) &&
       (pFVar2->tags[(ulong)(uVar5 & 0xffff) - 1] == '\x01')) {
      sVar4 = sVar4 + -1;
      pFVar2->n_points = sVar4;
    }
  }
  if (0 < (short)uVar1) {
    if (uVar6 == (int)sVar4 - 1U) {
      pFVar2->n_contours = uVar1 - 1;
      pFVar2->n_points = sVar4 + -1;
      return;
    }
    pFVar2->contours[(ulong)uVar1 - 1] = (short)((int)sVar4 - 1U);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_builder_close_contour( T1_Builder  builder )
  {
    FT_Outline*  outline = builder->current;
    FT_Int       first;


    if ( !outline )
      return;

    first = outline->n_contours <= 1
            ? 0 : outline->contours[outline->n_contours - 2] + 1;

    /* in malformed fonts it can happen that a contour was started */
    /* but no points were added                                    */
    if ( outline->n_contours && first == outline->n_points )
    {
      outline->n_contours--;
      return;
    }

    /* We must not include the last point in the path if it */
    /* is located on the first point.                       */
    if ( outline->n_points > 1 )
    {
      FT_Vector*  p1      = outline->points + first;
      FT_Vector*  p2      = outline->points + outline->n_points - 1;
      FT_Byte*    control = (FT_Byte*)outline->tags + outline->n_points - 1;


      /* `delete' last point only if it coincides with the first */
      /* point and it is not a control point (which can happen). */
      if ( p1->x == p2->x && p1->y == p2->y )
        if ( *control == FT_CURVE_TAG_ON )
          outline->n_points--;
    }

    if ( outline->n_contours > 0 )
    {
      /* Don't add contours only consisting of one point, i.e.,  */
      /* check whether the first and the last point is the same. */
      if ( first == outline->n_points - 1 )
      {
        outline->n_contours--;
        outline->n_points--;
      }
      else
        outline->contours[outline->n_contours - 1] =
          (short)( outline->n_points - 1 );
    }
  }